

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

void Flush(VP8BitWriter *bw)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  VP8BitWriter *in_RDI;
  int value;
  size_t pos;
  int32_t bits;
  int s;
  size_t local_18;
  
  iVar2 = in_RDI->nb_bits + 8;
  bVar4 = (byte)iVar2;
  uVar3 = in_RDI->value >> (bVar4 & 0x1f);
  in_RDI->value = in_RDI->value - (uVar3 << (bVar4 & 0x1f));
  in_RDI->nb_bits = in_RDI->nb_bits + -8;
  if ((uVar3 & 0xff) == 0xff) {
    in_RDI->run = in_RDI->run + 1;
  }
  else {
    local_18 = in_RDI->pos;
    iVar2 = BitWriterResize(in_RDI,CONCAT44(iVar2,uVar3));
    if (iVar2 != 0) {
      if (((uVar3 & 0x100) != 0) && (local_18 != 0)) {
        in_RDI->buf[local_18 - 1] = in_RDI->buf[local_18 - 1] + '\x01';
      }
      if (0 < in_RDI->run) {
        uVar1 = 0xff;
        if ((uVar3 & 0x100) != 0) {
          uVar1 = '\0';
        }
        while (0 < in_RDI->run) {
          in_RDI->buf[local_18] = uVar1;
          in_RDI->run = in_RDI->run + -1;
          local_18 = local_18 + 1;
        }
      }
      in_RDI->buf[local_18] = (uint8_t)uVar3;
      in_RDI->pos = local_18 + 1;
    }
  }
  return;
}

Assistant:

static void Flush(VP8BitWriter* const bw) {
  const int s = 8 + bw->nb_bits;
  const int32_t bits = bw->value >> s;
  assert(bw->nb_bits >= 0);
  bw->value -= bits << s;
  bw->nb_bits -= 8;
  if ((bits & 0xff) != 0xff) {
    size_t pos = bw->pos;
    if (!BitWriterResize(bw, bw->run + 1)) {
      return;
    }
    if (bits & 0x100) {  // overflow -> propagate carry over pending 0xff's
      if (pos > 0) bw->buf[pos - 1]++;
    }
    if (bw->run > 0) {
      const int value = (bits & 0x100) ? 0x00 : 0xff;
      for (; bw->run > 0; --bw->run) bw->buf[pos++] = value;
    }
    bw->buf[pos++] = bits & 0xff;
    bw->pos = pos;
  } else {
    bw->run++;   // delay writing of bytes 0xff, pending eventual carry.
  }
}